

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O1

void ncnn::draw_line_yuv420sp
               (uchar *yuv420sp,int w,int h,int x0,int y0,int x1,int y1,uint color,int thickness)

{
  int thickness_00;
  
  draw_line_c1(yuv420sp,w,h,w,x0,y0,x1,y1,color & 0xff,thickness);
  if (thickness == -1) {
    thickness_00 = -1;
  }
  else {
    thickness_00 = 1;
    if (1 < thickness / 2) {
      thickness_00 = thickness / 2;
    }
  }
  draw_line_c2(yuv420sp + h * w,w / 2,h / 2,w - (w >> 0x1f) & 0xfffffffe,x0 / 2,y0 / 2,x1 / 2,y1 / 2
               ,color >> 8 & 0xffff,thickness_00);
  return;
}

Assistant:

void draw_line_yuv420sp(unsigned char* yuv420sp, int w, int h, int x0, int y0, int x1, int y1, unsigned int color, int thickness)
{
    // assert w % 2 == 0
    // assert h % 2 == 0
    // assert x0 % 2 == 0
    // assert y0 % 2 == 0
    // assert x1 % 2 == 0
    // assert y1 % 2 == 0
    // assert thickness % 2 == 0

    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned int v_y;
    unsigned int v_uv;
    unsigned char* pen_color_y = (unsigned char*)&v_y;
    unsigned char* pen_color_uv = (unsigned char*)&v_uv;
    pen_color_y[0] = pen_color[0];
    pen_color_uv[0] = pen_color[1];
    pen_color_uv[1] = pen_color[2];

    unsigned char* Y = yuv420sp;
    draw_line_c1(Y, w, h, x0, y0, x1, y1, v_y, thickness);

    unsigned char* UV = yuv420sp + w * h;
    int thickness_uv = thickness == -1 ? thickness : std::max(thickness / 2, 1);
    draw_line_c2(UV, w / 2, h / 2, x0 / 2, y0 / 2, x1 / 2, y1 / 2, v_uv, thickness_uv);
}